

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_nextmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  size_t sVar2;
  char *mapname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (netgame) {
    Printf("Use \x1c+changemap\x1c- instead. \x1c+Nextmap\x1c- is for single-player only.\n");
  }
  else {
    sVar2 = FString::Len(&level.NextMap);
    if ((sVar2 != 0) && (iVar1 = FString::Compare(&level.NextMap,"enDSeQ",6), iVar1 != 0)) {
      mapname = FString::operator_cast_to_char_(&level.NextMap);
      G_DeferedInitNew(mapname,-1);
      return;
    }
    Printf("no next map!\n");
  }
  return;
}

Assistant:

CCMD(nextmap)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Nextmap"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}
	
	if (level.NextMap.Len() > 0 && level.NextMap.Compare("enDSeQ", 6))
	{
		G_DeferedInitNew(level.NextMap);
	}
	else
	{
		Printf("no next map!\n");
	}
}